

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O2

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::UsesImageView
          (FramebufferCacheKey *this,VkImageView View)

{
  VkImageView *ppVVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (this->NumRenderTargets == uVar2) {
      return this->ShadingRate == View || this->DSV == View;
    }
    ppVVar1 = this->RTVs + uVar2;
    uVar2 = uVar2 + 1;
  } while (*ppVVar1 != View);
  return true;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::UsesImageView(VkImageView View) const
{
    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
    {
        if (RTVs[rt] == View)
            return true;
    }
    return DSV == View || ShadingRate == View;
}